

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaConfig.cpp
# Opt level: O2

void __thiscall NaConfigPart::NaConfigPart(NaConfigPart *this,char *szType)

{
  size_t sVar1;
  char *__dest;
  undefined4 *puVar2;
  
  this->_vptr_NaConfigPart = (_func_int **)&PTR__NaConfigPart_00173e90;
  if (szType != (char *)0x0) {
    sVar1 = strlen(szType);
    __dest = (char *)operator_new__(sVar1 + 1);
    this->szTypeName = __dest;
    strcpy(__dest,szType);
    this->szInstanceName = (char *)0x0;
    this->pSelfData = (void *)0x0;
    return;
  }
  puVar2 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar2 = 0;
  __cxa_throw(puVar2,&NaException::typeinfo,0);
}

Assistant:

NaConfigPart::NaConfigPart (const char* szType)
{
    if(NULL == szType)
        throw(na_null_pointer);
    szTypeName = new char[strlen(szType) + 1];
    strcpy(szTypeName, szType);

    szInstanceName = NULL;

    pSelfData = NULL;
}